

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_queue_examples.cpp
# Opt level: O2

void density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::
     func_queue_reentrant_put_samples(ostream *i_ostream)

{
  bool bVar1;
  ostream *poVar2;
  value_type *pvVar3;
  undefined8 *puVar4;
  void *pvVar5;
  int iVar6;
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue;
  double last_val;
  ControlBlock *local_88;
  type return_value;
  anon_class_8_1_90f47376 func;
  PrintScopeDuration dur;
  
  PrintScopeDuration::PrintScopeDuration(&dur,i_ostream,"function queue reentrant put samples");
  queue.m_queue.m_head = (ControlBlock *)0xffef;
  queue.m_queue.m_tail = (ControlBlock *)0xffef;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(anon_class_1_0_00000001 *)&return_value);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(anon_class_1_0_00000001 *)&return_value);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(anon_class_1_0_00000001 *)&return_value);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(anon_class_1_0_00000001 *)&return_value);
  do {
    bVar1 = density::
            function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_reentrant_consume_impl(&queue);
  } while (bVar1);
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~function_queue(&queue);
  func.last_val = &last_val;
  last_val = 1.0;
  queue.m_queue.m_head = (ControlBlock *)0xffef;
  queue.m_queue.m_tail = (ControlBlock *)0xffef;
  iVar6 = 10;
  while (bVar1 = iVar6 != 0, iVar6 = iVar6 + -1, bVar1) {
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,double()>,density::basic_default_allocator<65536ul>>
    ::
    reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_&>
              ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,double()>,density::basic_default_allocator<65536ul>>
                *)&queue,&func);
  }
  while( true ) {
    density::
    function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::try_reentrant_consume_impl
              ((function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&return_value,&queue);
    if (return_value.m_has_value == false) break;
    poVar2 = std::ostream::_M_insert<double>((double)return_value.m_storage);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  density::
  function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~function_queue((function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                     *)&queue);
  queue.m_queue.m_head = (ControlBlock *)0xffef;
  queue.m_queue.m_tail = (ControlBlock *)0xffef;
  return_value.m_storage._0_4_ = 7;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(int *)&return_value);
  bVar1 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_reentrant_consume_impl(&queue);
  if (!bVar1) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0xf7,
                  "static void density_tests::FunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~function_queue(&queue);
  last_val = 3.23706870498726e-319;
  local_88 = (ControlBlock *)0xffef;
  func.last_val = (double *)0x0;
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  start_reentrant_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            ((reentrant_put_transaction<typename_std::decay<Func>::type> *)&return_value,&last_val,
             (Func_conflict *)&func);
  queue.m_queue.m_head = (ControlBlock *)return_value.m_storage;
  return_value.m_storage = (type)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)&return_value);
  pvVar3 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((reentrant_put_transaction<Func> *)&queue,(char (*) [12])"Hello world");
  puVar4 = (undefined8 *)
           density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element_ptr((reentrant_put_transaction<Func> *)&queue)
  ;
  *puVar4 = pvVar3;
  pvVar3 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((reentrant_put_transaction<Func> *)&queue,(char (*) [18])"\t(I\'m so happy)!!"
                     );
  pvVar5 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element_ptr((reentrant_put_transaction<Func> *)&queue)
  ;
  *(value_type **)((long)pvVar5 + 8) = pvVar3;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)&queue);
  bVar1 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_reentrant_consume_impl
                    ((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                      *)&last_val);
  if (!bVar1) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0x117,
                  "static void density_tests::FunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)&queue);
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                     *)&last_val);
  last_val = 3.23706870498726e-319;
  local_88 = (ControlBlock *)0xffef;
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  start_reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            ((reentrant_put_transaction<Func> *)&return_value,&last_val);
  queue.m_queue.m_head = (ControlBlock *)return_value.m_storage;
  return_value.m_storage = (type)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)&return_value);
  pvVar3 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((reentrant_put_transaction<Func> *)&queue,(char (*) [12])"Hello world");
  puVar4 = (undefined8 *)
           density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element_ptr((reentrant_put_transaction<Func> *)&queue)
  ;
  *puVar4 = pvVar3;
  pvVar3 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((reentrant_put_transaction<Func> *)&queue,(char (*) [18])"\t(I\'m so happy)!!"
                     );
  pvVar5 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element_ptr((reentrant_put_transaction<Func> *)&queue)
  ;
  *(value_type **)((long)pvVar5 + 8) = pvVar3;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)&queue);
  bVar1 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_reentrant_consume_impl
                    ((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                      *)&last_val);
  if (bVar1) {
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction
              ((reentrant_put_transaction<Func> *)&queue);
    density::
    function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::~function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                       *)&last_val);
    PrintScopeDuration::~PrintScopeDuration(&dur);
    return;
  }
  __assert_fail("invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                ,0x135,
                "static void density_tests::FunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
               );
}

Assistant:

static void func_queue_reentrant_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "function queue reentrant put samples");

            using namespace density;

            {
                //! [function_queue reentrant_push example 1]
                function_queue<void(), default_allocator, ERASURE> queue;
                queue.reentrant_push([] { std::cout << "Hello"; });
                queue.reentrant_push([] { std::cout << " world"; });
                queue.reentrant_push([] { std::cout << "!!!"; });
                queue.reentrant_push([] { std::cout << std::endl; });
                while (queue.try_reentrant_consume())
                    ;
                //! [function_queue reentrant_push example 1]
            }
            {
                //! [function_queue reentrant_push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                function_queue<double(), default_allocator, ERASURE> queue;
                for (int i = 0; i < 10; i++)
                    queue.reentrant_push(func);

                while (auto const return_value = queue.try_reentrant_consume())
                    std::cout << *return_value << std::endl;
                //! [function_queue reentrant_push example 2]
            }
            {
                //! [function_queue reentrant_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;
                queue.template reentrant_emplace<Func>(7);

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue reentrant_emplace example 1]
                (void)invoked;
            }
            {
                //! [function_queue start_reentrant_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;

                auto transaction = queue.start_reentrant_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                // now transaction is empty

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue start_reentrant_push example 1]
                (void)invoked;
            }
            {
                //! [function_queue start_reentrant_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;

                auto transaction = queue.template start_reentrant_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue start_reentrant_emplace example 1]
                (void)invoked;
            }
        }